

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestServer.hpp
# Opt level: O2

void __thiscall
test_server::TestServer::TestServer
          (TestServer *this,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args)

{
  ostream *poVar1;
  child *this_00;
  char (*in_RCX) [2];
  string stringized;
  
  (this->child)._M_t.
  super___uniq_ptr_impl<boost::process::child,_std::default_delete<boost::process::child>_>._M_t.
  super__Tuple_impl<0UL,_boost::process::child_*,_std::default_delete<boost::process::child>_>.
  super__Head_base<0UL,_boost::process::child_*,_false>._M_head_impl = (child *)0x0;
  boost::algorithm::join<std::initializer_list<std::__cxx11::string>,char[2]>
            (&stringized,(algorithm *)args,
             (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1b248d,in_RCX);
  poVar1 = std::operator<<((ostream *)&std::cout,"going to fork to start: ");
  poVar1 = std::operator<<(poVar1,(string *)&stringized);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (child *)operator_new(0x20);
  boost::process::child::child<std::__cxx11::string&>(this_00,&stringized);
  std::__uniq_ptr_impl<boost::process::child,_std::default_delete<boost::process::child>_>::reset
            ((__uniq_ptr_impl<boost::process::child,_std::default_delete<boost::process::child>_> *)
             this,this_00);
  std::__cxx11::string::~string((string *)&stringized);
  return;
}

Assistant:

TestServer(std::initializer_list<std::string> &&args) {
        std::string stringized = boost::algorithm::join(args, " ");
        std::cout << "going to fork to start: " << stringized << std::endl;
        auto process = new boost::process::child(stringized);
        child.reset(process);
    }